

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

idx_t duckdb::SortKeyConstantOperator<double>::Decode
                (const_data_ptr_t input,Vector *result,idx_t result_idx,bool flip_bytes)

{
  ulong uVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  ulong uVar3;
  
  if ((int)CONCAT71(in_register_00000009,flip_bytes) == 0) {
    uVar2 = *(ulong *)input;
  }
  else {
    uVar2 = ~*(ulong *)input;
  }
  uVar1 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28;
  uVar3 = uVar1 | uVar2 << 0x38;
  if (uVar3 + 2 < 3) {
    uVar2 = *(ulong *)(&DAT_01dfb918 + uVar3 * 8);
  }
  else {
    uVar2 = uVar1 | uVar2 << 0x38 & 0x7fffffffffffffff;
    if (-1 < (long)uVar3) {
      uVar2 = ~uVar3;
    }
  }
  *(ulong *)(result->data + result_idx * 8) = uVar2;
  return 8;
}

Assistant:

static inline data_ptr_t GetData(Vector &vector) {
		D_ASSERT(vector.GetVectorType() == VectorType::CONSTANT_VECTOR ||
		         vector.GetVectorType() == VectorType::FLAT_VECTOR);
		return vector.data;
	}